

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseCompiler::onDetach(BaseCompiler *this,CodeHolder *code)

{
  Error EVar1;
  
  this->_func = (FuncNode *)0x0;
  *(undefined8 *)&this->_vRegArray = 0;
  *(undefined8 *)&this->field_0x1f0 = 0;
  this->_constPools[0] = (ConstPoolNode *)0x0;
  this->_constPools[1] = (ConstPoolNode *)0x0;
  Zone::reset(&this->_vRegZone,kSoft);
  EVar1 = BaseBuilder::onDetach(&this->super_BaseBuilder,code);
  return EVar1;
}

Assistant:

Error BaseCompiler::onDetach(CodeHolder* code) noexcept {
  _func = nullptr;
  _constPools[uint32_t(ConstPoolScope::kLocal)] = nullptr;
  _constPools[uint32_t(ConstPoolScope::kGlobal)] = nullptr;

  _vRegArray.reset();
  _vRegZone.reset();

  return Base::onDetach(code);
}